

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwGetMouseButton(GLFWwindow *handle,int button)

{
  char *format;
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    if ((uint)button < 8) {
      if ((char)handle[(ulong)(uint)button + 0x54] != 3) {
        return (int)(char)handle[(ulong)(uint)button + 0x54];
      }
      handle[(ulong)(uint)button + 0x54] = (GLFWwindow)0x0;
      return 1;
    }
    format = "The specified mouse button is invalid";
    error = 0x10003;
  }
  _glfwInputError(error,format);
  return 0;
}

Assistant:

GLFWAPI int glfwGetMouseButton(GLFWwindow* handle, int button)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (button < 0 || button > GLFW_MOUSE_BUTTON_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM,
                        "The specified mouse button is invalid");
        return GLFW_RELEASE;
    }

    if (window->mouseButton[button] == _GLFW_STICK)
    {
        // Sticky mode: release mouse button now
        window->mouseButton[button] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->mouseButton[button];
}